

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_ref_t * wasm_table_get(wasm_table_t *table,wasm_table_size_t index)

{
  Result RVar1;
  Table *this;
  RefPtr<wabt::interp::Object> *this_00;
  Ref ref;
  RefPtr<wabt::interp::Object> local_30;
  
  this = wasm_ref_t::As<wabt::interp::Table>((wasm_ref_t *)table);
  RVar1 = wabt::interp::Table::Get(this,index,&ref);
  if ((RVar1.enum_ == Error) || (ref.index == 0)) {
    this_00 = (RefPtr<wabt::interp::Object> *)0x0;
  }
  else {
    this_00 = (RefPtr<wabt::interp::Object> *)operator_new(0x18);
    wabt::interp::RefPtr<wabt::interp::Object>::RefPtr
              (&local_30,(table->super_wasm_extern_t).super_wasm_ref_t.I.store_,ref);
    wabt::interp::RefPtr<wabt::interp::Object>::RefPtr(this_00,&local_30);
    wabt::interp::RefPtr<wabt::interp::Object>::reset(&local_30);
  }
  return (wasm_ref_t *)this_00;
}

Assistant:

own wasm_ref_t* wasm_table_get(const wasm_table_t* table,
                               wasm_table_size_t index) {
  Ref ref;
  if (Failed(table->As<Table>()->Get(index, &ref))) {
    return nullptr;
  }
  if (ref == Ref::Null) {
    return nullptr;
  }
  return new wasm_ref_t{table->I.store()->UnsafeGet<Object>(ref)};
}